

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
* __thiscall
BoardView::SearchPartsAndNets
          (pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
           *__return_storage_ptr__,BoardView *this,char *search,int limit)

{
  SharedVector<Net> nets;
  SharedVector<Component> parts;
  allocator<char> local_99;
  vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> local_98;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> local_78;
  string local_60;
  SharedVector<Component> local_40;
  
  local_78.
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->m_searchComponents == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,search,&local_99);
    Searcher::parts(&local_40,&this->searcher,&local_60,limit);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
    _M_move_assign(&local_78,&local_40);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
              (&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (this->m_searchNets == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,search,&local_99);
    Searcher::nets((SharedVector<Net> *)&local_40,&this->searcher,&local_60,limit);
    std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::_M_move_assign
              (&local_98,&local_40);
    std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector
              ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  ::
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_&,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_&,_true>
            (__return_storage_ptr__,&local_78,&local_98);
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector(&local_98);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
            (&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::pair<SharedVector<Component>, SharedVector<Net>> BoardView::SearchPartsAndNets(const char *search, int limit) {
	SharedVector<Component> parts;
	SharedVector<Net> nets;
	if (m_searchComponents) parts = searcher.parts(search, limit);
	if (m_searchNets) nets = searcher.nets(search, limit);
	return {parts, nets};
}